

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int loadline(lua_State *L)

{
  int iVar1;
  undefined4 local_1c;
  int status;
  lua_State *L_local;
  
  lua_settop(L,0);
  iVar1 = pushline(L,1);
  if (iVar1 == 0) {
    L_local._4_4_ = -1;
  }
  else {
    local_1c = addreturn(L);
    if (local_1c != 0) {
      local_1c = multiline(L);
    }
    lua_rotate(L,1,-1);
    lua_settop(L,-2);
    L_local._4_4_ = local_1c;
  }
  return L_local._4_4_;
}

Assistant:

static int loadline (lua_State *L) {
  int status;
  lua_settop(L, 0);
  if (!pushline(L, 1))
    return -1;  /* no input */
  if ((status = addreturn(L)) != LUA_OK)  /* 'return ...' did not work? */
    status = multiline(L);  /* try as command, maybe with continuation lines */
  lua_remove(L, 1);  /* remove line from the stack */
  lua_assert(lua_gettop(L) == 1);
  return status;
}